

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

FaceIter __thiscall CMU462::HalfedgeMesh::eraseVertex(HalfedgeMesh *this,VertexIter v)

{
  pointer *pp_Var1;
  pointer *this_00;
  bool bVar2;
  pointer pVVar3;
  HalfedgeIter *pHVar4;
  pointer pHVar5;
  VertexIter *pVVar6;
  EdgeIter *pEVar7;
  FaceIter *pFVar8;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  *pvVar9;
  reference pvVar10;
  reference this_01;
  reference this_02;
  pointer this_03;
  reference p_Var11;
  reference p_Var12;
  reference p_Var13;
  _List_iterator<CMU462::Face> *fj;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  *__range1_3;
  _List_iterator<CMU462::Edge> *ej;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  *__range1_2;
  _List_iterator<CMU462::Halfedge> *hj_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  *__range1_1;
  _List_iterator<CMU462::Halfedge> *hj_1;
  iterator __end1;
  iterator __begin1;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  *__range1;
  Index i;
  Size n;
  HalfedgeIter hj;
  HalfedgeIter hi;
  HalfedgeIter hp;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_to_be_deleted;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_to_be_deleted;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  v_outer_vec;
  undefined1 local_90 [8];
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_all;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_last;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_first;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_to_be_deleted;
  HalfedgeIter ht;
  HalfedgeIter h;
  HalfedgeMesh *this_local;
  VertexIter v_local;
  FaceIter f0;
  
  this_local = (HalfedgeMesh *)v._M_node;
  pVVar3 = std::_List_iterator<CMU462::Vertex>::operator->
                     ((_List_iterator<CMU462::Vertex> *)&this_local);
  pHVar4 = Vertex::halfedge(pVVar3);
  ht._M_node = pHVar4->_M_node;
  pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&ht);
  pHVar4 = Halfedge::twin(pHVar5);
  h_to_be_deleted.
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar4->_M_node;
  pp_Var1 = &h_outer_first.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)pp_Var1);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)&h_outer_last.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)&h_outer_all.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)local_90);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)pp_Var1,&ht);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&h_outer_first.
                  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
              (value_type *)
              &h_to_be_deleted.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&ht);
  pHVar4 = Halfedge::next(pHVar5);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&h_outer_last.
                  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pHVar4);
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
            *)&e_to_be_deleted.
               super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)
                      &h_to_be_deleted.
                       super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar6 = Halfedge::vertex(pHVar5);
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
               *)&e_to_be_deleted.
                  super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar6);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
          *)&f_to_be_deleted.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&ht);
  pEVar7 = Halfedge::edge(pHVar5);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             *)&f_to_be_deleted.
                super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar7);
  pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&ht);
  pFVar8 = Halfedge::face(pHVar5);
  v_local._M_node = pFVar8->_M_node;
  std::
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
  vector((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
          *)&hp);
  hi._M_node = (_List_node_base *)
               h_to_be_deleted.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hi);
  pHVar4 = Halfedge::next(pHVar5);
  hj._M_node = pHVar4->_M_node;
  while (bVar2 = std::operator!=(&hj,&ht), bVar2) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&h_outer_first.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&hj);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hj);
    pHVar4 = Halfedge::twin(pHVar5);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&h_outer_first.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pHVar4);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hj);
    pHVar4 = Halfedge::next(pHVar5);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&h_outer_last.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pHVar4);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hj);
    pHVar4 = Halfedge::twin(pHVar5);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar4);
    pVVar6 = Halfedge::vertex(pHVar5);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 *)&e_to_be_deleted.
                    super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar6);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hj);
    pEVar7 = Halfedge::edge(pHVar5);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
               *)&f_to_be_deleted.
                  super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar7);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hj);
    pFVar8 = Halfedge::face(pHVar5);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               *)&hp,pFVar8);
    n = (Size)hj._M_node;
    while( true ) {
      pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)&n);
      pHVar4 = Halfedge::next(pHVar5);
      bVar2 = std::operator!=(pHVar4,&hi);
      if (!bVar2) break;
      pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)&n);
      pHVar4 = Halfedge::next(pHVar5);
      n = (Size)pHVar4->_M_node;
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)local_90,(value_type *)&n);
    }
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&h_outer_all.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&n);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hj);
    pHVar4 = Halfedge::twin(pHVar5);
    hi._M_node = pHVar4->_M_node;
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hi);
    pHVar4 = Halfedge::next(pHVar5);
    hj._M_node = pHVar4->_M_node;
  }
  while( true ) {
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hj);
    pHVar4 = Halfedge::next(pHVar5);
    bVar2 = std::operator!=(pHVar4,&hi);
    if (!bVar2) break;
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(&hj);
    pHVar4 = Halfedge::next(pHVar5);
    hj._M_node = pHVar4->_M_node;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)local_90,&hj);
  }
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&h_outer_all.
                  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&hj);
  pvVar9 = (vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::size((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      *)&h_outer_last.
                         super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (__range1 = (vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)0x0; __range1 < pvVar9;
      __range1 = (vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)((long)&(__range1->
                            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar10 = std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            *)&h_outer_last.
                               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)__range1);
    this_01 = std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            *)&h_outer_all.
                               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)__range1);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(this_01);
    pHVar4 = Halfedge::next(pHVar5);
    pHVar4->_M_node = pvVar10->_M_node;
    pvVar10 = std::
              vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            *)&h_outer_last.
                               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)__range1);
    this_02 = std::
              vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
              ::operator[]((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                            *)&e_to_be_deleted.
                               super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)__range1);
    pVVar3 = std::_List_iterator<CMU462::Vertex>::operator->(this_02);
    pHVar4 = Vertex::halfedge(pVVar3);
    pHVar4->_M_node = pvVar10->_M_node;
  }
  __end1 = std::
           vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ::begin((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    *)local_90);
  hj_1 = (_List_iterator<CMU462::Halfedge> *)
         std::
         vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ::end((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                *)local_90);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
                                     *)&hj_1), bVar2) {
    p_Var11 = __gnu_cxx::
              __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator*(&__end1);
    pHVar5 = std::_List_iterator<CMU462::Halfedge>::operator->(p_Var11);
    pFVar8 = Halfedge::face(pHVar5);
    pFVar8->_M_node = v_local._M_node;
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
    ::operator++(&__end1);
  }
  pvVar10 = std::
            vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ::front((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                     *)&h_outer_last.
                        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_03 = std::_List_iterator<CMU462::Face>::operator->((_List_iterator<CMU462::Face> *)&v_local);
  pHVar4 = Face::halfedge(this_03);
  pHVar4->_M_node = pvVar10->_M_node;
  pp_Var1 = &h_outer_first.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_1 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::begin((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      *)pp_Var1);
  hj_2 = (_List_iterator<CMU462::Halfedge> *)
         std::
         vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ::end((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                *)pp_Var1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&hj_2), bVar2) {
    p_Var11 = __gnu_cxx::
              __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator*(&__end1_1);
    deleteHalfedge(this,p_Var11->_M_node);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
    ::operator++(&__end1_1);
  }
  deleteVertex(this,(VertexIter)this_local);
  this_00 = &f_to_be_deleted.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_2 = std::
             vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             ::begin((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                      *)this_00);
  ej = (_List_iterator<CMU462::Edge> *)
       std::
       vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
       ::end((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::_List_iterator<CMU462::Edge>_*,_std::vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>_>
                             *)&ej), bVar2) {
    p_Var12 = __gnu_cxx::
              __normal_iterator<std::_List_iterator<CMU462::Edge>_*,_std::vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>_>
              ::operator*(&__end1_2);
    deleteEdge(this,p_Var12->_M_node);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<CMU462::Edge>_*,_std::vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::
             vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ::begin((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                      *)&hp);
  fj = (_List_iterator<CMU462::Face> *)
       std::
       vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
       ::end((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
              *)&hp);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<std::_List_iterator<CMU462::Face>_*,_std::vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>_>
                             *)&fj), bVar2) {
    p_Var13 = __gnu_cxx::
              __normal_iterator<std::_List_iterator<CMU462::Face>_*,_std::vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>_>
              ::operator*(&__end1_3);
    deleteFace(this,p_Var13->_M_node);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<CMU462::Face>_*,_std::vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>_>
    ::operator++(&__end1_3);
  }
  std::
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
  ~vector((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
           *)&hp);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  ~vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
           *)&f_to_be_deleted.
              super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
             *)&e_to_be_deleted.
                super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)local_90);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)&h_outer_all.
                super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)&h_outer_last.
                super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)&h_outer_first.
                super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (FaceIter)v_local._M_node;
}

Assistant:

FaceIter HalfedgeMesh::eraseVertex(VertexIter v) {
  // This method should replace the given vertex and all its neighboring
  // edges and faces with a single face, returning the new face.

  // Collect
  // HalfEdges
  auto h = v->halfedge(), ht = h->twin();
  vector<HalfedgeIter> h_to_be_deleted, h_outer_first, h_outer_last, h_outer_all;
  h_to_be_deleted.push_back(h);
  h_to_be_deleted.push_back(ht);
  h_outer_first.push_back(h->next());

  // Vertices
  vector<VertexIter> v_outer_vec;
  v_outer_vec.push_back(ht->vertex());

  // Edges
  vector<EdgeIter> e_to_be_deleted;
  e_to_be_deleted.push_back(h->edge());

  // Faces
  auto f0 = h->face();
  vector<FaceIter> f_to_be_deleted;

  // Iterations through remaining
  auto hp = ht, hi = hp->next();
  while (hi != h) {
    h_to_be_deleted.push_back(hi);
    h_to_be_deleted.push_back(hi->twin());
    h_outer_first.push_back(hi->next());

    v_outer_vec.push_back(hi->twin()->vertex());
    e_to_be_deleted.push_back(hi->edge());
    f_to_be_deleted.push_back(hi->face());

    auto hj = hi;
    while (hj->next() != hp) {
      hj = hj->next();
      h_outer_all.push_back(hj);
    }
    h_outer_last.push_back(hj);

    hp = hi->twin();
    hi = hp->next();
  }
  while (hi->next() != hp) {
    hi = hi->next();
    h_outer_all.push_back(hi);
  }
  h_outer_last.push_back(hi);

  // Reassign
  Size n = h_outer_first.size();
  for (Index i = 0; i < n; ++i) {
    h_outer_last[i]->next() = h_outer_first[i];
    v_outer_vec[i]->halfedge() = h_outer_first[i];
  }
  for (auto& hj : h_outer_all) {
    hj->face() = f0;
  }
  f0->halfedge() = h_outer_first.front();

  // Delete
  for (auto& hj : h_to_be_deleted) {
    deleteHalfedge(hj);
  }
  deleteVertex(v);
  for (auto& ej : e_to_be_deleted) {
    deleteEdge(ej);
  }
  for (auto& fj : f_to_be_deleted) {
    deleteFace(fj);
  }

  return f0;
}